

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.cc
# Opt level: O3

int onmt::unicode::get_script_code(char *script_name)

{
  undefined8 *puVar1;
  int iVar2;
  undefined8 *puVar3;
  
  puVar1 = DAT_00383658;
  puVar3 = compat_scripts;
  while( true ) {
    if (puVar3 == puVar1) {
      iVar2 = u_getPropertyValueEnum_70(0x100a,script_name);
      return iVar2;
    }
    iVar2 = strcmp(script_name,(char *)*puVar3);
    if (iVar2 == 0) break;
    puVar3 = puVar3 + 3;
  }
  return *(int *)(puVar3 + 1);
}

Assistant:

int get_script_code(const char* script_name)
    {
      for (const auto& pair : compat_scripts)
      {
        const auto& script_info = pair.first;
        if (strcmp(script_name, script_info.first) == 0)
          return script_info.second;
      }

      return u_getPropertyValueEnum(UCHAR_SCRIPT, script_name);
    }